

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts3Appendf(int *pRc,char **pz,char *zFormat,...)

{
  char in_AL;
  char *p;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_f8;
  undefined1 local_d8 [24];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (*pRc == 0) {
    local_f8.reg_save_area = local_d8;
    local_f8.overflow_arg_area = &ap[0].overflow_arg_area;
    local_f8.gp_offset = 0x18;
    local_f8.fp_offset = 0x30;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    p = sqlite3_vmprintf(zFormat,&local_f8);
    if (p == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = p;
      if (*pz != (char *)0x0) {
        pcVar1 = sqlite3_mprintf("%s%s",*pz,p);
        sqlite3_free(p);
      }
    }
    if (pcVar1 == (char *)0x0) {
      *pRc = 7;
    }
    sqlite3_free(*pz);
    *pz = pcVar1;
  }
  return;
}

Assistant:

static void fts3Appendf(
  int *pRc,                       /* IN/OUT: Error code */
  char **pz,                      /* IN/OUT: Pointer to string buffer */
  const char *zFormat,            /* Printf format string to append */
  ...                             /* Arguments for printf format string */
){
  if( *pRc==SQLITE_OK ){
    va_list ap;
    char *z;
    va_start(ap, zFormat);
    z = sqlite3_vmprintf(zFormat, ap);
    va_end(ap);
    if( z && *pz ){
      char *z2 = sqlite3_mprintf("%s%s", *pz, z);
      sqlite3_free(z);
      z = z2;
    }
    if( z==0 ) *pRc = SQLITE_NOMEM;
    sqlite3_free(*pz);
    *pz = z;
  }
}